

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O2

char * __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1>
::
Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1>,_google::protobuf::Map<long,_double>_>
::_InternalParse(Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1>,_google::protobuf::Map<long,_double>_>
                 *this,char *ptr,ParseContext *ctx)

{
  long *out;
  uint32_t *puVar1;
  size_type sVar2;
  double *pdVar3;
  bool bVar4;
  value_type *pvVar5;
  MapEntryImpl<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1>
  *pMVar6;
  char *local_28;
  
  local_28 = ptr;
  bVar4 = ParseContext::Done(ctx,&local_28);
  if (bVar4) {
    if (local_28 == (char *)0x0) {
      return (char *)0x0;
    }
  }
  else if (*local_28 == '\b') {
    out = &this->key_;
    local_28 = VarintParse<unsigned_long>(local_28 + 1,(unsigned_long *)out);
    if (local_28 == (char *)0x0) {
      return (char *)0x0;
    }
    bVar4 = ParseContext::Done(ctx,&local_28);
    if (bVar4) {
      if (local_28 == (char *)0x0) {
        return (char *)0x0;
      }
LAB_00199383:
      NewEntry(this);
    }
    else {
      if (*local_28 != '\x11') goto LAB_00199383;
      sVar2 = *(size_type *)this->map_;
      pvVar5 = Map<long,double>::InnerMap::operator[]<long_const&>((InnerMap *)this->map_,out);
      this->value_ptr_ = (double *)(pvVar5 + 8);
      if (sVar2 == (this->map_->elements_).num_elements_) goto LAB_00199383;
      *(undefined8 *)(pvVar5 + 8) = *(undefined8 *)(local_28 + 1);
      local_28 = local_28 + 9;
      bVar4 = ParseContext::Done(ctx,&local_28);
      if (bVar4) {
        return local_28;
      }
      if (local_28 == (char *)0x0) {
        return (char *)0x0;
      }
      NewEntry(this);
      pdVar3 = this->value_ptr_;
      pMVar6 = this->entry_;
      puVar1 = pMVar6->_has_bits_;
      *puVar1 = *puVar1 | 2;
      pMVar6->value_ = *pdVar3;
      Map<long,_double>::erase<long>(this->map_,out);
    }
    pMVar6 = this->entry_;
    pMVar6->_has_bits_[0] = pMVar6->_has_bits_[0] | 1;
    pMVar6->key_ = this->key_;
    goto LAB_0019939b;
  }
  NewEntry(this);
  pMVar6 = this->entry_;
LAB_0019939b:
  local_28 = MapEntryImpl<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1>
             ::_InternalParse(pMVar6,local_28,ctx);
  if (local_28 == (char *)0x0) {
    return (char *)0x0;
  }
  UseKeyAndValueFromEntry(this);
  return local_28;
}

Assistant:

const char* _InternalParse(const char* ptr, ParseContext* ctx) {
      if (PROTOBUF_PREDICT_TRUE(!ctx->Done(&ptr) && *ptr == kKeyTag)) {
        ptr = KeyTypeHandler::Read(ptr + 1, ctx, &key_);
        if (PROTOBUF_PREDICT_FALSE(!ptr || !Derived::ValidateKey(&key_))) {
          return nullptr;
        }
        if (PROTOBUF_PREDICT_TRUE(!ctx->Done(&ptr) && *ptr == kValueTag)) {
          typename Map::size_type map_size = map_->size();
          value_ptr_ = &(*map_)[key_];
          if (PROTOBUF_PREDICT_TRUE(map_size != map_->size())) {
            using T =
                typename MapIf<ValueTypeHandler::kIsEnum, int*, Value*>::type;
            ptr = ValueTypeHandler::Read(ptr + 1, ctx,
                                         reinterpret_cast<T>(value_ptr_));
            if (PROTOBUF_PREDICT_FALSE(!ptr ||
                                       !Derived::ValidateValue(value_ptr_))) {
              map_->erase(key_);  // Failure! Undo insertion.
              return nullptr;
            }
            if (PROTOBUF_PREDICT_TRUE(ctx->Done(&ptr))) return ptr;
            if (!ptr) return nullptr;
            NewEntry();
            ValueMover::Move(value_ptr_, entry_->mutable_value());
            map_->erase(key_);
            goto move_key;
          }
        } else {
          if (!ptr) return nullptr;
        }
        NewEntry();
      move_key:
        KeyMover::Move(&key_, entry_->mutable_key());
      } else {
        if (!ptr) return nullptr;
        NewEntry();
      }
      ptr = entry_->_InternalParse(ptr, ctx);
      if (ptr) UseKeyAndValueFromEntry();
      return ptr;
    }